

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readpsm.c
# Opt level: O0

int pattcmp(uchar *a,uchar *b,size_t l)

{
  ulong uVar1;
  size_t in_RDX;
  void *in_RSI;
  void *in_RDI;
  char *p;
  int k;
  int nb;
  int na;
  size_t j;
  size_t i;
  char *local_48;
  int local_3c;
  int local_38;
  int local_34;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  void *local_18;
  void *local_10;
  int local_4;
  
  local_34 = 0;
  local_38 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_3c = memcmp(in_RDI,in_RSI,in_RDX);
  if (local_3c == 0) {
    local_4 = 0;
  }
  else {
    for (local_28 = 0;
        (local_28 < local_20 &&
        ((*(byte *)((long)local_10 + local_28) < 0x30 ||
         (0x39 < *(byte *)((long)local_10 + local_28))))); local_28 = local_28 + 1) {
    }
    if (local_28 < local_20) {
      uVar1 = strtoul((char *)((long)local_10 + local_28),&local_48,10);
      local_34 = (int)uVar1;
      if (local_48 == (char *)((long)local_10 + local_28)) {
        return 1;
      }
    }
    for (local_30 = 0;
        (local_30 < local_20 &&
        ((*(byte *)((long)local_18 + local_30) < 0x30 ||
         (0x39 < *(byte *)((long)local_18 + local_30))))); local_30 = local_30 + 1) {
    }
    if (local_30 < local_20) {
      uVar1 = strtoul((char *)((long)local_18 + local_30),&local_48,10);
      local_38 = (int)uVar1;
      if (local_48 == (char *)((long)local_18 + local_30)) {
        return -1;
      }
    }
    if (local_28 < local_30) {
      local_4 = -1;
    }
    else if (local_28 < local_30) {
      local_4 = 1;
    }
    else {
      local_4 = memcmp(local_10,local_18,local_30);
      if (local_4 == 0) {
        local_4 = local_34 - local_38;
      }
    }
  }
  return local_4;
}

Assistant:

int pattcmp( const unsigned char * a, const unsigned char * b, size_t l )
{
	size_t i, j;
	int na = 0, nb = 0, k;
	char * p;

	k = memcmp( a, b, l );
	if ( !k ) return k;

	/* damnit */

	for ( i = 0; i < l; ++i )
	{
		if ( a [i] >= '0' && a [i] <= '9' ) break;
	}

	if ( i < l )
	{
		na = strtoul( (const char *)a + i, &p, 10 );
		if ( p == (const char *)a + i ) return 1;
	}

	for ( j = 0; j < l; ++j )
	{
		if ( b [j] >= '0' && b [j] <= '9' ) break;
	}

	if ( j < l )
	{
		nb = strtoul( (const char *)b + j, &p, 10 );
		if ( p == (const char *)b + j ) return -1;
	}

	if ( i < j ) return -1;
	else if ( j > i ) return 1;

	k = memcmp( a, b, j );
	if ( k ) return k;

	return na - nb;
}